

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O2

void t_warn(rm *loc)

{
  byte bVar1;
  char *pcVar2;
  
  bVar1 = loc->typ - 8;
  if (bVar1 < 4) {
    pcVar2 = &DAT_0028d818 + *(int *)(&DAT_0028d818 + (ulong)bVar1 * 4);
  }
  else {
    pcVar2 = "unknown";
  }
  impossible("wall_angle: %s: case %d: seenv = 0x%x",pcVar2,
             (ulong)(*(uint *)&loc->field_0x6 >> 4 & 7),(ulong)loc->seenv);
  return;
}

Assistant:

static void t_warn(struct rm *loc)
{
    static const char warn_str[] = "wall_angle: %s: case %d: seenv = 0x%x";
    const char *wname;

    if (loc->typ == TUWALL) wname = "tuwall";
    else if (loc->typ == TLWALL) wname = "tlwall";
    else if (loc->typ == TRWALL) wname = "trwall";
    else if (loc->typ == TDWALL) wname = "tdwall";
    else wname = "unknown";
    impossible(warn_str, wname, loc->wall_info & WM_MASK,
	(unsigned int) loc->seenv);
}